

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

bool CLI::detail::process_quoted_string(string *str,char string_char,char literal_char)

{
  char cVar1;
  string *str_00;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  string local_60;
  string local_40;
  char local_1a;
  char local_19;
  char literal_char_local;
  string *psStack_18;
  char string_char_local;
  string *str_local;
  
  local_1a = literal_char;
  local_19 = string_char;
  psStack_18 = str;
  uVar3 = ::std::__cxx11::string::size();
  if (uVar3 < 2) {
    return false;
  }
  bVar2 = is_binary_escaped_string(psStack_18);
  if (!bVar2) {
    pcVar4 = (char *)::std::__cxx11::string::front();
    if ((*pcVar4 == local_19) &&
       (pcVar4 = (char *)::std::__cxx11::string::back(), *pcVar4 == local_19)) {
      remove_outer(psStack_18,local_19);
      lVar5 = ::std::__cxx11::string::find_first_of((char)psStack_18,0x5c);
      if (lVar5 != -1) {
        remove_escaped_characters(&local_60,psStack_18);
        ::std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
      }
      handle_secondary_array(psStack_18);
      return true;
    }
    pcVar4 = (char *)::std::__cxx11::string::front();
    if ((*pcVar4 == local_1a) || (pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == '`'))
    {
      pcVar4 = (char *)::std::__cxx11::string::back();
      cVar1 = *pcVar4;
      pcVar4 = (char *)::std::__cxx11::string::front();
      str_00 = psStack_18;
      if (cVar1 == *pcVar4) {
        pcVar4 = (char *)::std::__cxx11::string::front();
        remove_outer(str_00,*pcVar4);
        handle_secondary_array(psStack_18);
        return true;
      }
    }
    return false;
  }
  extract_binary_string(&local_40,psStack_18);
  ::std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  handle_secondary_array(psStack_18);
  return true;
}

Assistant:

CLI11_INLINE bool process_quoted_string(std::string &str, char string_char, char literal_char) {
    if(str.size() <= 1) {
        return false;
    }
    if(detail::is_binary_escaped_string(str)) {
        str = detail::extract_binary_string(str);
        handle_secondary_array(str);
        return true;
    }
    if(str.front() == string_char && str.back() == string_char) {
        detail::remove_outer(str, string_char);
        if(str.find_first_of('\\') != std::string::npos) {
            str = detail::remove_escaped_characters(str);
        }
        handle_secondary_array(str);
        return true;
    }
    if((str.front() == literal_char || str.front() == '`') && str.back() == str.front()) {
        detail::remove_outer(str, str.front());
        handle_secondary_array(str);
        return true;
    }
    return false;
}